

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseArgumentsCommand.cxx
# Opt level: O2

bool cmParseArgumentsCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  bool escape;
  bool bVar3;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  _Var4;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var5;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  _Var6;
  string *psVar7;
  ostream *poVar8;
  cmValue __args;
  _Base_ptr p_Var9;
  char *pcVar10;
  string *this;
  string *key_1;
  ulong uVar11;
  pointer pbVar12;
  pointer pbVar13;
  string *key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  unsigned_long uVar14;
  string_view arg;
  string_view name;
  string_view name_00;
  string_view name_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_bool>
  pVar15;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar16;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_bool>
  pVar17;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view separator;
  string_view value_03;
  string argc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  ulong local_390;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  unsigned_long argvStart;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsed;
  string prefix;
  unsigned_long count;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  keywordsMissingValues;
  UserArgumentParser parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  multi_map multiValArgs;
  single_map singleValArgs;
  options_map options;
  ostringstream argName;
  undefined1 auStack_1d0 [8];
  cmExecutionStatus local_1c8 [5];
  ParseResult local_60;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar11 = (long)pbVar1 - (long)__lhs;
  if (uVar11 < 0x61) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&argName,"must be called with at least 4 arguments.",
               (allocator<char> *)&parser);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    psVar7 = (string *)&argName;
  }
  else {
    argvStart = 0;
    escape = std::operator==(__lhs,"PARSE_ARGV");
    if (escape) {
      if ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start == 0xc0) {
        bVar3 = cmStrToULong(__lhs + 1,&argvStart);
        if (bVar3) {
          __lhs = __lhs + 2;
          goto LAB_001f5451;
        }
        pcVar2 = status->Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                       "PARSE_ARGV index \'",__lhs + 1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&argName
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser
                       ,"\' is not an unsigned integer");
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&argName);
        std::__cxx11::string::~string((string *)&argName);
        this = (string *)&parser;
      }
      else {
        pcVar2 = status->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&argName,"PARSE_ARGV must be called with exactly 6 arguments.",
                   (allocator<char> *)&parser);
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&argName);
        this = (string *)&argName;
      }
      std::__cxx11::string::~string(this);
      cmSystemTools::s_FatalErrorOccurred = true;
      goto LAB_001f5e67;
    }
LAB_001f5451:
    local_390 = uVar11;
    std::operator+(&prefix,__lhs,"_");
    parser.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    parser.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    parser.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword._M_invoker =
         (_Invoker_type)0x0;
    parser.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parser.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
    _M_functor._8_8_ = 0;
    parser.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
    _M_manager = (_Manager_type)0x0;
    parser.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue._M_invoker =
         (_Invoker_type)0x0;
    parser.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
    _M_functor._M_unused._M_object = (void *)0x0;
    parser.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.super__Function_base
    ._M_functor._8_8_ = 0;
    parser.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.super__Function_base
    ._M_manager = (_Manager_type)0x0;
    options._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &options._M_t._M_impl.super__Rb_tree_header._M_header;
    options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header;
    singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    singleValArgs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header;
    multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    multiValArgs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    parser.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    parser.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.super__Function_base
    ._M_functor._M_unused._M_object = (void *)0x0;
    unparsed.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    parser.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parser.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    unparsed.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unparsed.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    arg._M_str = __lhs[1]._M_dataplus._M_p;
    arg._M_len = __lhs[1]._M_string_length;
    multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    options._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         options._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    cmExpandedList_abi_cxx11_(&list,arg,false);
    pbVar13 = list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    _argName = status;
    for (pbVar12 = list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar13;
        pbVar12 = pbVar12 + 1) {
      argc._M_dataplus._M_p = argc._M_dataplus._M_p & 0xffffffffffffff00;
      pVar15 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
               ::_M_emplace_unique<std::__cxx11::string_const&,bool>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                           *)&options,pbVar12,(bool *)&argc);
      _Var4 = pVar15.first._M_node;
      name._M_str = *(char **)(_Var4._M_node + 1);
      name._M_len = (size_t)_Var4._M_node[1]._M_parent;
      bVar3 = cmArgumentParser<void>::Bind<bool>
                        (&parser.super_cmArgumentParser<void>,name,(bool *)(_Var4._M_node + 2));
      if (!bVar3) {
        cmParseArgumentsCommand::anon_class_8_1_6bf1c130::operator()
                  ((anon_class_8_1_6bf1c130 *)&argName,pbVar12);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&list);
    arg_00._M_str = __lhs[2]._M_dataplus._M_p;
    arg_00._M_len = __lhs[2]._M_string_length;
    cmExpandList(arg_00,&list,false);
    pbVar13 = list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    argc._M_dataplus._M_p = (pointer)status;
    for (pbVar12 = list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar13;
        pbVar12 = pbVar12 + 1) {
      _argName = local_1c8;
      auStack_1d0 = (undefined1  [8])0x0;
      local_1c8[0].Makefile = (cmMakefile *)((ulong)local_1c8[0].Makefile & 0xffffffffffffff00);
      pVar16 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                           *)&singleValArgs,pbVar12,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &argName);
      _Var5 = pVar16.first._M_node;
      std::__cxx11::string::~string((string *)&argName);
      name_00._M_str = *(char **)(_Var5._M_node + 1);
      name_00._M_len = (size_t)_Var5._M_node[1]._M_parent;
      bVar3 = cmArgumentParser<void>::Bind<std::__cxx11::string>
                        (&parser.super_cmArgumentParser<void>,name_00,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (_Var5._M_node + 2));
      if (!bVar3) {
        cmParseArgumentsCommand::anon_class_8_1_6bf1c130::operator()
                  ((anon_class_8_1_6bf1c130 *)&argc,pbVar12);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&list);
    arg_01._M_str = __lhs[3]._M_dataplus._M_p;
    arg_01._M_len = __lhs[3]._M_string_length;
    cmExpandList(arg_01,&list,false);
    pbVar12 = __lhs + 4;
    argc._M_dataplus._M_p = (pointer)status;
    for (pbVar13 = list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar13 !=
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar13 = pbVar13 + 1) {
      _argName = (cmExecutionStatus *)0x0;
      auStack_1d0 = (undefined1  [8])0x0;
      local_1c8[0].Makefile = (cmMakefile *)0x0;
      pVar17 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>
               ::
               _M_emplace_unique<std::__cxx11::string_const&,ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>
                           *)&multiValArgs,pbVar13,
                          (NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&argName);
      _Var6 = pVar17.first._M_node;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&argName);
      name_01._M_str = *(char **)(_Var6._M_node + 1);
      name_01._M_len = (size_t)_Var6._M_node[1]._M_parent;
      bVar3 = cmArgumentParser<void>::
              Bind<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        (&parser.super_cmArgumentParser<void>,name_01,
                         (NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(_Var6._M_node + 2));
      if (!bVar3) {
        cmParseArgumentsCommand::anon_class_8_1_6bf1c130::operator()
                  ((anon_class_8_1_6bf1c130 *)&argc,pbVar13);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&list);
    if (escape) {
      pcVar2 = status->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&argName,"ARGC",(allocator<char> *)&local_3b0);
      psVar7 = cmMakefile::GetSafeDefinition(pcVar2,(string *)&argName);
      std::__cxx11::string::string((string *)&argc,(string *)psVar7);
      std::__cxx11::string::~string((string *)&argName);
      bVar3 = cmStrToULong(&argc,&count);
      if (bVar3) {
        uVar14 = argvStart;
        do {
          if (count <= uVar14) {
            std::__cxx11::string::~string((string *)&argc);
            goto LAB_001f5a80;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&argName);
          poVar8 = std::operator<<((ostream *)&argName,"ARGV");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          pcVar2 = status->Makefile;
          std::__cxx11::stringbuf::str();
          __args = cmMakefile::GetDefinition(pcVar2,&local_3b0);
          std::__cxx11::string::~string((string *)&local_3b0);
          if (__args.Value == (string *)0x0) {
            pcVar2 = status->Makefile;
            std::__cxx11::stringbuf::str();
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &keywordsMissingValues,"PARSE_ARGV called with ",&local_288);
            std::operator+(&local_3b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &keywordsMissingValues," not set");
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_3b0);
            std::__cxx11::string::~string((string *)&local_3b0);
            std::__cxx11::string::~string((string *)&keywordsMissingValues);
            std::__cxx11::string::~string((string *)&local_288);
            cmSystemTools::s_FatalErrorOccurred = true;
          }
          else {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
                       __args.Value);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&argName);
          uVar14 = uVar14 + 1;
        } while (__args.Value != (string *)0x0);
        std::__cxx11::string::~string((string *)&argc);
        uVar11 = local_390;
      }
      else {
        pcVar2 = status->Makefile;
        std::operator+(&local_3b0,"PARSE_ARGV called with ARGC=\'",&argc);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&argName
                       ,&local_3b0,"\' that is not an unsigned integer");
        uVar11 = local_390;
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&argName);
        std::__cxx11::string::~string((string *)&argName);
        std::__cxx11::string::~string((string *)&local_3b0);
        cmSystemTools::s_FatalErrorOccurred = true;
        std::__cxx11::string::~string((string *)&argc);
      }
    }
    else {
      for (; pbVar12 != pbVar1; pbVar12 = pbVar12 + 1) {
        arg_02._M_str = (pbVar12->_M_dataplus)._M_p;
        arg_02._M_len = pbVar12->_M_string_length;
        cmExpandList(arg_02,&list,false);
      }
LAB_001f5a80:
      _argName = &keywordsMissingValues;
      keywordsMissingValues.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      keywordsMissingValues.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      keywordsMissingValues.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      auStack_1d0 = (undefined1  [8])0x0;
      local_1c8[0].Error._M_dataplus._M_p =
           (pointer)std::
                    _Function_handler<void_(ArgumentParser::Instance_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmParseArgumentsCommand.cxx:54:7)>
                    ::_M_invoke;
      local_1c8[0].Makefile =
           (cmMakefile *)
           std::
           _Function_handler<void_(ArgumentParser::Instance_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmParseArgumentsCommand.cxx:54:7)>
           ::_M_manager;
      ArgumentParser::Base::BindKeywordMissingValue((Base *)&parser,(KeywordNameAction *)&argName);
      std::_Function_base::~_Function_base((_Function_base *)&argName);
      cmArgumentParser<void>::
      Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_60,(cmArgumentParser<void> *)&parser,&list,&unparsed,0);
      std::
      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_60);
      pcVar2 = status->Makefile;
      std::
      set<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::
      set<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>>
                ((set<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)&argName,
                 (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  )keywordsMissingValues.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  )keywordsMissingValues.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      for (p_Var9 = options._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &options._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        std::operator+(&argc,&prefix,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var9 + 1));
        uVar11 = (ulong)(byte)(char)p_Var9[2]._M_color;
        pcVar10 = "FALSE";
        if (uVar11 != 0) {
          pcVar10 = "TRUE";
        }
        value._M_len = uVar11 ^ 5;
        value._M_str = pcVar10;
        cmMakefile::AddDefinition(pcVar2,&argc,value);
        std::__cxx11::string::~string((string *)&argc);
      }
      for (p_Var9 = singleValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &singleValArgs._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        if (p_Var9[2]._M_parent == (_Base_ptr)0x0) {
          std::operator+(&argc,&prefix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var9 + 1));
          cmMakefile::RemoveDefinition(pcVar2,&argc);
        }
        else {
          std::operator+(&argc,&prefix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var9 + 1));
          value_00._M_str = *(char **)(p_Var9 + 2);
          value_00._M_len = (size_t)p_Var9[2]._M_parent;
          cmMakefile::AddDefinition(pcVar2,&argc,value_00);
        }
        std::__cxx11::string::~string((string *)&argc);
      }
      for (p_Var9 = multiValArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &multiValArgs._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        if (*(_Base_ptr *)(p_Var9 + 2) == p_Var9[2]._M_parent) {
          std::operator+(&argc,&prefix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var9 + 1));
          cmMakefile::RemoveDefinition(pcVar2,&argc);
        }
        else {
          std::operator+(&argc,&prefix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var9 + 1));
          JoinList(&local_3b0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(p_Var9 + 2),escape);
          value_01._M_str = local_3b0._M_dataplus._M_p;
          value_01._M_len = local_3b0._M_string_length;
          cmMakefile::AddDefinition(pcVar2,&argc,value_01);
          std::__cxx11::string::~string((string *)&local_3b0);
        }
        std::__cxx11::string::~string((string *)&argc);
      }
      if (unparsed.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          unparsed.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator+(&argc,&prefix,"UNPARSED_ARGUMENTS");
        uVar11 = local_390;
        cmMakefile::RemoveDefinition(pcVar2,&argc);
      }
      else {
        std::operator+(&argc,&prefix,"UNPARSED_ARGUMENTS");
        uVar11 = local_390;
        JoinList(&local_3b0,&unparsed,escape);
        value_02._M_str = local_3b0._M_dataplus._M_p;
        value_02._M_len = local_3b0._M_string_length;
        cmMakefile::AddDefinition(pcVar2,&argc,value_02);
        std::__cxx11::string::~string((string *)&local_3b0);
      }
      std::__cxx11::string::~string((string *)&argc);
      if (local_1c8[0].Error.field_2._M_allocated_capacity == 0) {
        std::operator+(&argc,&prefix,"KEYWORDS_MISSING_VALUES");
        cmMakefile::RemoveDefinition(pcVar2,&argc);
      }
      else {
        std::operator+(&argc,&prefix,"KEYWORDS_MISSING_VALUES");
        local_288._M_string_length = (size_type)auStack_1d0;
        local_288._M_dataplus._M_p = local_1c8[0].Error._M_dataplus._M_p;
        separator._M_str = ";";
        separator._M_len = 1;
        cmJoin<cmRange<std::_Rb_tree_const_iterator<std::basic_string_view<char,std::char_traits<char>>>>>
                  (&local_3b0,
                   (cmRange<std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)&local_288,separator);
        value_03._M_str = local_3b0._M_dataplus._M_p;
        value_03._M_len = local_3b0._M_string_length;
        cmMakefile::AddDefinition(pcVar2,&argc,value_03);
        std::__cxx11::string::~string((string *)&local_3b0);
      }
      std::__cxx11::string::~string((string *)&argc);
      std::
      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)&argName);
      std::
      _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Vector_base(&keywordsMissingValues.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     );
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&list);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&unparsed);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ::~_Rb_tree(&multiValArgs._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&singleValArgs._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~_Rb_tree(&options._M_t);
    ArgumentParser::ActionMap::~ActionMap((ActionMap *)&parser);
    psVar7 = &prefix;
  }
  std::__cxx11::string::~string((string *)psVar7);
LAB_001f5e67:
  return 0x60 < uVar11;
}

Assistant:

bool cmParseArgumentsCommand(std::vector<std::string> const& args,
                             cmExecutionStatus& status)
{
  // cmake_parse_arguments(prefix options single multi <ARGN>)
  //                         1       2      3      4
  // or
  // cmake_parse_arguments(PARSE_ARGV N prefix options single multi)
  if (args.size() < 4) {
    status.SetError("must be called with at least 4 arguments.");
    return false;
  }

  auto argIter = args.begin();
  auto argEnd = args.end();
  bool parseFromArgV = false;
  unsigned long argvStart = 0;
  if (*argIter == "PARSE_ARGV") {
    if (args.size() != 6) {
      status.GetMakefile().IssueMessage(
        MessageType::FATAL_ERROR,
        "PARSE_ARGV must be called with exactly 6 arguments.");
      cmSystemTools::SetFatalErrorOccurred();
      return true;
    }
    parseFromArgV = true;
    argIter++; // move past PARSE_ARGV
    if (!cmStrToULong(*argIter, &argvStart)) {
      status.GetMakefile().IssueMessage(MessageType::FATAL_ERROR,
                                        "PARSE_ARGV index '" + *argIter +
                                          "' is not an unsigned integer");
      cmSystemTools::SetFatalErrorOccurred();
      return true;
    }
    argIter++; // move past N
  }
  // the first argument is the prefix
  const std::string prefix = (*argIter++) + "_";

  UserArgumentParser parser;

  // define the result maps holding key/value pairs for
  // options, single values and multi values
  options_map options;
  single_map singleValArgs;
  multi_map multiValArgs;

  // anything else is put into a vector of unparsed strings
  std::vector<std::string> unparsed;

  auto const duplicateKey = [&status](std::string const& key) {
    status.GetMakefile().IssueMessage(
      MessageType::WARNING, "keyword defined more than once: " + key);
  };

  // the second argument is a (cmake) list of options without argument
  std::vector<std::string> list = cmExpandedList(*argIter++);
  parser.Bind(list, options, duplicateKey);

  // the third argument is a (cmake) list of single argument options
  list.clear();
  cmExpandList(*argIter++, list);
  parser.Bind(list, singleValArgs, duplicateKey);

  // the fourth argument is a (cmake) list of multi argument options
  list.clear();
  cmExpandList(*argIter++, list);
  parser.Bind(list, multiValArgs, duplicateKey);

  list.clear();
  if (!parseFromArgV) {
    // Flatten ;-lists in the arguments into a single list as was done
    // by the original function(CMAKE_PARSE_ARGUMENTS).
    for (; argIter != argEnd; ++argIter) {
      cmExpandList(*argIter, list);
    }
  } else {
    // in the PARSE_ARGV move read the arguments from ARGC and ARGV#
    std::string argc = status.GetMakefile().GetSafeDefinition("ARGC");
    unsigned long count;
    if (!cmStrToULong(argc, &count)) {
      status.GetMakefile().IssueMessage(MessageType::FATAL_ERROR,
                                        "PARSE_ARGV called with ARGC='" +
                                          argc +
                                          "' that is not an unsigned integer");
      cmSystemTools::SetFatalErrorOccurred();
      return true;
    }
    for (unsigned long i = argvStart; i < count; ++i) {
      std::ostringstream argName;
      argName << "ARGV" << i;
      cmValue arg = status.GetMakefile().GetDefinition(argName.str());
      if (!arg) {
        status.GetMakefile().IssueMessage(MessageType::FATAL_ERROR,
                                          "PARSE_ARGV called with " +
                                            argName.str() + " not set");
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }
      list.emplace_back(*arg);
    }
  }

  std::vector<cm::string_view> keywordsMissingValues;
  parser.BindKeywordsMissingValue(keywordsMissingValues);

  parser.Parse(list, &unparsed);

  PassParsedArguments(
    prefix, status.GetMakefile(), options, singleValArgs, multiValArgs,
    unparsed,
    options_set(keywordsMissingValues.begin(), keywordsMissingValues.end()),
    parseFromArgV);

  return true;
}